

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

bool flatbuffers::GenerateGoGRPC(Parser *parser,string *path,string *file_name)

{
  pointer ppSVar1;
  bool bVar2;
  pointer ppSVar3;
  int iVar4;
  GoGRPCGenerator local_a0;
  
  ppSVar3 = (parser->services_).vec.
            super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (parser->services_).vec.
            super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  if (ppSVar3 != ppSVar1) {
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (((*ppSVar3)->super_Definition).generated ^ 1);
      ppSVar3 = ppSVar3 + 1;
    } while (ppSVar3 != ppSVar1);
    if (iVar4 != 0) {
      GoGRPCGenerator::GoGRPCGenerator(&local_a0,parser,path,file_name);
      bVar2 = GoGRPCGenerator::generate(&local_a0);
      BaseGenerator::~BaseGenerator(&local_a0.super_BaseGenerator);
    }
  }
  return bVar2;
}

Assistant:

bool GenerateGoGRPC(const Parser &parser, const std::string &path,
                    const std::string &file_name) {
  int nservices = 0;
  for (auto it = parser.services_.vec.begin(); it != parser.services_.vec.end();
       ++it) {
    if (!(*it)->generated) nservices++;
  }
  if (!nservices) return true;
  return GoGRPCGenerator(parser, path, file_name).generate();
}